

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

void __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
          (SmallVector<wasm::Literal,_1UL> *this,initializer_list<wasm::Literal> init)

{
  Literal *pLVar1;
  long lVar2;
  undefined1 local_40 [8];
  Literal item;
  
  pLVar1 = init._M_array;
  (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fixed)._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  (this->fixed)._M_elems[0].type.id = 0;
  this->usedFixed = 0;
  (this->fixed)._M_elems[0].field_0.i64 = 0;
  (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (init._M_len != 0) {
    lVar2 = init._M_len * 0x18;
    do {
      ::wasm::Literal::Literal((Literal *)local_40,pLVar1);
      push_back(this,(Literal *)local_40);
      ::wasm::Literal::~Literal((Literal *)local_40);
      pLVar1 = pLVar1 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

SmallVector(std::initializer_list<T> init) {
    for (T item : init) {
      push_back(item);
    }
  }